

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall BuildTestInterruptCleanup::Run(BuildTestInterruptCleanup *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Test *pTVar4;
  bool bVar5;
  int iVar6;
  Node *pNVar7;
  TimeStamp TVar8;
  Builder *this_01;
  string err;
  string local_70;
  string local_50;
  
  iVar6 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule interrupt\n  command = interrupt\nrule touch-interrupt\n  command = touch-interrupt\nbuild out1: interrupt in1\nbuild out2: touch-interrupt in2\n"
              ,(ManifestParserOptions)0x0);
  if (iVar6 == g_current_test->assertion_failures_) {
    paVar2 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out1","");
    paVar3 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out2","");
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    piVar1 = &(this->super_BuildTest).fs_.now_;
    *piVar1 = *piVar1 + 1;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"in1","");
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"in2","");
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    pTVar4 = g_current_test;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar3;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out1","");
    this_01 = &(this->super_BuildTest).builder_;
    pNVar7 = Builder::AddTarget(this_01,&local_70,&local_50);
    testing::Test::Check
              (pTVar4,pNVar7 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6e7,"builder_.AddTarget(\"out1\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pTVar4 = g_current_test;
    iVar6 = std::__cxx11::string::compare((char *)&local_50);
    testing::Test::Check
              (pTVar4,iVar6 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6e8,"\"\" == err");
    pTVar4 = g_current_test;
    bVar5 = Builder::Build(this_01,&local_50);
    testing::Test::Check
              (pTVar4,!bVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6e9,"builder_.Build(&err)");
    pTVar4 = g_current_test;
    iVar6 = std::__cxx11::string::compare((char *)&local_50);
    testing::Test::Check
              (pTVar4,iVar6 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6ea,"\"interrupted by user\" == err");
    Builder::Cleanup(this_01);
    pTVar4 = g_current_test;
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out1","");
    TVar8 = VirtualFileSystem::Stat(this_00,&local_70,&local_50);
    testing::Test::Check
              (pTVar4,0 < TVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6ec,"fs_.Stat(\"out1\", &err) > 0");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)local_50._M_string_length,0x19fc4c);
    pTVar4 = g_current_test;
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out2","");
    pNVar7 = Builder::AddTarget(this_01,&local_70,&local_50);
    testing::Test::Check
              (pTVar4,pNVar7 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6f0,"builder_.AddTarget(\"out2\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pTVar4 = g_current_test;
    iVar6 = std::__cxx11::string::compare((char *)&local_50);
    testing::Test::Check
              (pTVar4,iVar6 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6f1,"\"\" == err");
    pTVar4 = g_current_test;
    bVar5 = Builder::Build(this_01,&local_50);
    testing::Test::Check
              (pTVar4,!bVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6f2,"builder_.Build(&err)");
    pTVar4 = g_current_test;
    iVar6 = std::__cxx11::string::compare((char *)&local_50);
    testing::Test::Check
              (pTVar4,iVar6 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6f3,"\"interrupted by user\" == err");
    Builder::Cleanup(this_01);
    pTVar4 = g_current_test;
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out2","");
    TVar8 = VirtualFileSystem::Stat(this_00,&local_70,&local_50);
    testing::Test::Check
              (pTVar4,TVar8 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x6f5,"0 == fs_.Stat(\"out2\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildTest, InterruptCleanup) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule interrupt\n"
"  command = interrupt\n"
"rule touch-interrupt\n"
"  command = touch-interrupt\n"
"build out1: interrupt in1\n"
"build out2: touch-interrupt in2\n"));

  fs_.Create("out1", "");
  fs_.Create("out2", "");
  fs_.Tick();
  fs_.Create("in1", "");
  fs_.Create("in2", "");

  // An untouched output of an interrupted command should be retained.
  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_EQ("", err);
  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("interrupted by user", err);
  builder_.Cleanup();
  EXPECT_GT(fs_.Stat("out1", &err), 0);
  err = "";

  // A touched output of an interrupted command should be deleted.
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  EXPECT_EQ("", err);
  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("interrupted by user", err);
  builder_.Cleanup();
  EXPECT_EQ(0, fs_.Stat("out2", &err));
}